

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CopyInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,
          TopLevelASBase<Diligent::EngineVkImplTraits> *Src)

{
  uint uVar1;
  Uint32 UVar2;
  undefined3 uVar3;
  bool bVar4;
  size_t sVar5;
  IMemoryAllocator *Allocator;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
  Args_1;
  Char *pCVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>,_bool>
  pVar7;
  undefined1 local_88 [8];
  string msg;
  Char *local_58;
  char *NameCopy;
  value_type *SrcInst;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
  *__range2;
  TopLevelASBase<Diligent::EngineVkImplTraits> *Src_local;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  ClearInstanceData(this);
  sVar5 = StringPool::GetReservedSize(&Src->m_StringPool);
  Allocator = GetRawAllocator();
  StringPool::Reserve(&this->m_StringPool,sVar5,Allocator);
  UVar2 = (Src->m_BuildInfo).HitGroupStride;
  (this->m_BuildInfo).InstanceCount = (Src->m_BuildInfo).InstanceCount;
  (this->m_BuildInfo).HitGroupStride = UVar2;
  uVar3 = *(undefined3 *)&(Src->m_BuildInfo).field_0x9;
  UVar2 = (Src->m_BuildInfo).FirstContributionToHitGroupIndex;
  (this->m_BuildInfo).BindingMode = (Src->m_BuildInfo).BindingMode;
  *(undefined3 *)&(this->m_BuildInfo).field_0x9 = uVar3;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = UVar2;
  uVar1 = (Src->m_BuildInfo).LastContributionToHitGroupIndex;
  Args_1._M_cur = (__node_type *)(ulong)uVar1;
  (this->m_BuildInfo).LastContributionToHitGroupIndex = uVar1;
  __end0 = std::
           unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
           ::begin(&Src->m_Instances);
  SrcInst = (value_type *)
            std::
            unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
            ::end(&Src->m_Instances);
  while (bVar4 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                              *)&SrcInst), bVar4) {
    NameCopy = (char *)std::__detail::
                       _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
                       ::operator*(&__end0);
    pCVar6 = HashMapStringKey::GetStr((HashMapStringKey *)NameCopy);
    local_58 = StringPool::CopyString(&this->m_StringPool,pCVar6);
    pVar7 = std::
            unordered_map<Diligent::HashMapStringKey,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>>
            ::
            emplace<char_const*&,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc_const&>
                      ((unordered_map<Diligent::HashMapStringKey,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>>
                        *)&this->m_Instances,&local_58,(InstanceDesc *)(NameCopy + 0x10));
    Args_1._M_cur =
         (__node_type *)
         pVar7.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
         ._M_cur;
    msg.field_2._8_8_ = Args_1._M_cur;
    std::__detail::
    _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
    ::operator++(&__end0);
  }
  sVar5 = StringPool::GetRemainingSize(&this->m_StringPool);
  if (sVar5 != 0) {
    FormatString<char[26],char[43]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_StringPool.GetRemainingSize() == 0",
               (char (*) [43])Args_1._M_cur);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"CopyInstanceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xec);
    std::__cxx11::string::~string((string *)local_88);
  }
  LOCK();
  (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
       (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void CopyInstanceData(const TopLevelASBase& Src) noexcept
    {
        ClearInstanceData();

        this->m_StringPool.Reserve(Src.m_StringPool.GetReservedSize(), GetRawAllocator());
        this->m_BuildInfo = Src.m_BuildInfo;

        for (auto& SrcInst : Src.m_Instances)
        {
            const char* NameCopy = this->m_StringPool.CopyString(SrcInst.first.GetStr());
            this->m_Instances.emplace(NameCopy, SrcInst.second);
        }

        VERIFY_EXPR(this->m_StringPool.GetRemainingSize() == 0);

#ifdef DILIGENT_DEVELOPMENT
        this->m_DvpVersion.fetch_add(1);
#endif
    }